

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkIdUsed(CheckerVisitor *this,Id *id,Node *p,ValueRef *v)

{
  bool *pbVar1;
  TreeOp TVar2;
  SymbolInfo *pSVar3;
  byte bVar4;
  bool bVar5;
  BinExpr *bin;
  Node *pNVar6;
  PredicateCheckerVisitor local_50;
  
  if (p == (Node *)0x0) {
    pNVar6 = (Node *)0x0;
  }
  else if (p->_op == TO_EXPR_STMT) {
    pNVar6 = (Node *)p[1].super_ArenaObj._vptr_ArenaObj;
  }
  else {
    pNVar6 = (Node *)0x0;
    if (p->_op - TO_ID < 0x35) {
      pNVar6 = p;
    }
  }
  bVar5 = v->assigned;
  if ((pNVar6 != (Node *)0x0) &&
     (((TVar2 = pNVar6->_op, TVar2 - TO_PLUSEQ < 5 || (TVar2 == TO_ASSIGN)) &&
      ((Id *)pNVar6[1].super_ArenaObj._vptr_ArenaObj == id)))) {
    bVar4 = 1;
    if (v->info->usedAfterAssign == false) {
      local_50.deepCheck = true;
      local_50.result = false;
      local_50.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001a6070;
      local_50.checkee = (Node *)id;
      Node::visit<SQCompilation::PredicateCheckerVisitor>
                (*(Node **)&pNVar6[1]._coordinates,&local_50);
      bVar4 = local_50.result;
    }
    pSVar3 = v->info;
    pbVar1 = &pSVar3->used;
    *pbVar1 = (bool)(*pbVar1 | bVar4);
    v->assigned = true;
    v->lastAssigneeScope = this->currentScope;
    pSVar3->usedAfterAssign = false;
    if (TVar2 == TO_ASSIGN) {
      return;
    }
  }
  pSVar3 = v->info;
  pSVar3->used = true;
  if (bVar5 != false) {
    pSVar3->usedAfterAssign = true;
    if ((pNVar6 == (Node *)0x0) || ((int)pNVar6->_op < 0x2c)) {
      bVar5 = false;
    }
    else {
      bVar5 = (int)pNVar6->_op < 0x31;
    }
    v->assigned = bVar5;
  }
  if (v->state == VRS_UNDEFINED) {
    report(this,(Node *)id,0x86);
  }
  else if (v->state == VRS_PARTIALLY) {
    report(this,(Node *)id,0x85,id->_id);
  }
  return;
}

Assistant:

void CheckerVisitor::checkIdUsed(const Id *id, const Node *p, ValueRef *v) {
  const Expr *e = nullptr;
  if (p) {
    if (p->op() == TO_EXPR_STMT)
      e = static_cast<const ExprStatement *>(p)->expression();
    else if (p->isExpression())
      e = p->asExpression();
  }

  bool assigned = v->assigned;

  if (e && isAssignExpr(e)) {
    const BinExpr *bin = static_cast<const BinExpr *>(e);
    const Expr *lhs = bin->lhs();
    Expr *rhs = bin->rhs();
    bool simpleAsgn = e->op() == TO_ASSIGN;
    if (id == lhs) {
      bool used = v->info->usedAfterAssign || existsInTree(id, rhs);
      //if (!used && assigned && simpleAsgn) {
      //  if (!v->lastAssigneeScope || currentScope->owner == v->lastAssigneeScope->owner)
      //    report(bin, DiagnosticsId::DI_REASSIGN_WITH_NO_USAGE);
      //}
      v->info->used |= used;
      v->assigned = true;
      v->lastAssigneeScope = currentScope;
      v->info->usedAfterAssign = false;
      if (simpleAsgn)
        return;
    }
  }

  // it's usage
  v->info->used = true;
  if (assigned) {
    v->info->usedAfterAssign = true;
    v->assigned = e ? TO_PLUSEQ <= e->op() && e->op() <= TO_MODEQ : false;
  }

  if (v->state == VRS_PARTIALLY) {
    report(id, DiagnosticsId::DI_POSSIBLE_GARBAGE, id->id());
  }
  else if (v->state == VRS_UNDEFINED) {
    report(id, DiagnosticsId::DI_UNINITIALIZED_VAR);
  }
}